

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O0

int luabridge::detail::Invoke<unsigned_int,luabridge::detail::TypeList<unsigned_int,void>,1>::
    run<unsigned_int(*)(unsigned_int)>(lua_State *L,_func_uint_uint **fn)

{
  uint value;
  exception *e;
  TypeListValues<luabridge::detail::TypeList<unsigned_int,_void>_> local_28;
  ArgList<luabridge::detail::TypeList<unsigned_int,_void>,_1> args;
  _func_uint_uint **fn_local;
  lua_State *L_local;
  
  args.super_TypeListValues<luabridge::detail::TypeList<unsigned_int,_void>_> =
       (TypeListValues<luabridge::detail::TypeList<unsigned_int,_void>_>)fn;
  ArgList<luabridge::detail::TypeList<unsigned_int,_void>,_1>::ArgList
            ((ArgList<luabridge::detail::TypeList<unsigned_int,_void>,_1> *)&local_28,L);
  value = FuncTraits<unsigned_int_(*)(unsigned_int),_unsigned_int_(*)(unsigned_int)>::call
                    ((DeclType *)
                     args.super_TypeListValues<luabridge::detail::TypeList<unsigned_int,_void>_>,
                     &local_28);
  Stack<unsigned_int>::push(L,value);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }